

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O1

alpnid alpn2alpnid(char *name)

{
  int iVar1;
  alpnid aVar2;
  
  iVar1 = curl_strequal(name,"h1");
  aVar2 = ALPN_h1;
  if (iVar1 == 0) {
    iVar1 = curl_strequal(name,"h2");
    aVar2 = ALPN_h2;
    if (iVar1 == 0) {
      iVar1 = curl_strequal(name,"h3");
      aVar2 = (uint)(iVar1 != 0) << 5;
    }
  }
  return aVar2;
}

Assistant:

static enum alpnid alpn2alpnid(char *name)
{
  if(strcasecompare(name, "h1"))
    return ALPN_h1;
  if(strcasecompare(name, "h2"))
    return ALPN_h2;
  if(strcasecompare(name, H3VERSION))
    return ALPN_h3;
  return ALPN_none; /* unknown, probably rubbish input */
}